

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O2

void data_update_adadelta(data_t *data,double rate)

{
  float fVar1;
  data_val_t *pdVar2;
  float fVar3;
  long lVar4;
  double dVar5;
  
  for (lVar4 = 0; lVar4 < data->size; lVar4 = lVar4 + 1) {
    pdVar2 = data->grad;
    fVar1 = pdVar2[lVar4];
    fVar3 = data->m[lVar4] * 0.5 + fVar1 * 0.5 * fVar1;
    data->m[lVar4] = fVar3;
    fVar1 = pdVar2[lVar4];
    dVar5 = (double)fVar3 + 1e-06;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    data->val[lVar4] = (float)((double)data->val[lVar4] - ((double)fVar1 * rate) / dVar5);
    data->grad[lVar4] = 0.0;
  }
  return;
}

Assistant:

void data_update_adadelta(data_t *data, double rate)
{
    const double BETA = 0.5;
    const double EPSILON = 1e-6;

    int j = 0;

    for (j = 0; j < data->size; ++j)
    {
        data->m[j] = BETA * data->m[j] + (1 - BETA) * data->grad[j] * data->grad[j];
        data->val[j] -= rate * data->grad[j] / sqrt(data->m[j] + EPSILON);
        data->grad[j] = 0;
    }
}